

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O0

void draw_map(wchar_t cx,wchar_t cy)

{
  wchar_t wVar1;
  nh_dbuf_entry_conflict *dbe_00;
  int local_f0;
  int local_ec;
  nh_dbuf_entry *dbe;
  undefined1 local_d8 [4];
  wchar_t bg_color;
  curses_symdef syms [4];
  attr_t local_28;
  uint frame;
  attr_t attr;
  wchar_t cursy;
  wchar_t cursx;
  wchar_t symcount;
  wchar_t y;
  wchar_t x;
  wchar_t cy_local;
  wchar_t cx_local;
  
  if ((display_buffer != (nh_dbuf_entry (*) [80])0x0) && (mapwin != (WINDOW_conflict *)0x0)) {
    if (mapwin == (WINDOW_conflict *)0x0) {
      local_ec = -1;
      local_f0 = -1;
    }
    else {
      local_ec = (int)mapwin->_cury;
      local_f0 = (int)mapwin->_curx;
    }
    for (cursx = L'\0'; cursx < L'\x15'; cursx = cursx + L'\x01') {
      for (symcount = L'\x01'; symcount < L'P'; symcount = symcount + L'\x01') {
        dbe._4_4_ = L'\0';
        dbe_00 = (nh_dbuf_entry_conflict *)(display_buffer[cursx] + symcount);
        wmove(mapwin,cursx,symcount + L'\xffffffff');
        wVar1 = mapglyph(dbe_00,(curses_symdef *)local_d8,(wchar_t *)((long)&dbe + 4));
        local_28 = 0;
        if ((((settings.hilite_pet != '\0') && ((dbe_00->monflags & 1U) != 0)) ||
            ((settings.hilite_peaceful != '\0' && ((dbe_00->monflags & 0x10U) != 0)))) ||
           ((((dbe._4_4_ == L'\0' && (dbe_00->mon == 0)) && (dbe_00->invis == '\0')) &&
            ((dbe_00->obj != 0 && ((dbe_00->objflags & 1U) != 0)))))) {
          local_28 = 0x40000;
          dbe._4_4_ = L'\0';
        }
        print_sym((WINDOW *)mapwin,(curses_symdef *)(local_d8 + (0U % (ulong)(uint)wVar1) * 0x28),
                  local_28,dbe._4_4_);
      }
    }
    wmove(mapwin,local_ec,local_f0);
    wnoutrefresh(mapwin);
  }
  return;
}

Assistant:

void draw_map(int cx, int cy)
{
    int x, y, symcount, cursx, cursy;
    attr_t attr;
    unsigned int frame;
    struct curses_symdef syms[4];

    if (!display_buffer || !mapwin)
	return;

    getyx(mapwin, cursy, cursx);

    frame = 0;

    for (y = 0; y < ROWNO; y++) {
	for (x = 1; x < COLNO; x++) {
	    int bg_color = 0;
	    struct nh_dbuf_entry *dbe = &display_buffer[y][x];

	    /* set the position for each character to prevent incorrect
	     * positioning due to charset issues (IBM chars on a unicode term
	     * or vice versa) */
	    wmove(mapwin, y, x-1);

	    symcount = mapglyph(dbe, syms, &bg_color);
	    attr = A_NORMAL;
	    if ((settings.hilite_pet && (dbe->monflags & MON_TAME)) ||
		(settings.hilite_peaceful && (dbe->monflags & MON_PEACEFUL)) ||
		/* reverse object piles, but don't override stair background
		 * or monsters on top */
		(bg_color == 0 && !dbe->mon && !dbe->invis &&
		 dbe->obj && (dbe->objflags & DOBJ_STACKS))) {
		attr |= A_REVERSE;
		bg_color = 0;
	    }

	    print_sym(mapwin, &syms[frame % symcount], attr, bg_color);
	}
    }

    wmove(mapwin, cursy, cursx);
    wnoutrefresh(mapwin);
}